

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_long,char>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar3;
  unsigned_long uVar4;
  int iVar5;
  char in_stack_ffffffffffffffaf;
  char u;
  int local_48;
  undefined3 uStack_44;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  
  u = '\0';
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (&local_38,&u);
  _uStack_44 = CONCAT13(u,uStack_44);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (&st2,&su);
  local_38.m_int = 0;
  SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_38,&u);
  SafeCastHelper<unsigned_long,_char,_1>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (su.m_int,(unsigned_long *)&local_38);
  local_38.m_int = st2.m_int;
  SafeInt::operator_cast_to_char((SafeInt *)&local_38);
  SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_38,u);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_38.m_int;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = st2.m_int;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    operator*(u,local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    u = '\x01';
    iVar5 = 1;
    local_48 = iVar5;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,&local_48);
    local_48 = iVar5;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_48);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    local_48 = iVar5;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_48);
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (&local_38,st2);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    u = '\x01';
    local_48 = iVar5;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_48);
    local_48 = iVar5;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,&local_48);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              (&local_38,st2);
    operator/(u,local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              (&local_38,st2);
    operator+(u,local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    local_48 = 0;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,&local_48);
    u = '\0';
    local_48 = 0;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_48);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              (&local_38,st2);
    SVar3.m_int._4_4_ = _uStack_44;
    SVar3.m_int._0_4_ = local_48;
    operator-(in_stack_ffffffffffffffaf,SVar3);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    local_48 = iVar5;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,&local_48);
    local_48 = iVar5;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_48);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    u = '\x01';
    local_48 = iVar5;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_48);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SVar3 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_38,su);
    operator<<(SVar3.m_int,su);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SVar3 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_38,su);
    operator>>(SVar3.m_int,su);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,u);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,su);
    uVar4 = BinaryAndHelper<unsigned_long,_char,_1>::And(local_38.m_int,u);
    local_48._0_1_ = (SafeInt)((byte)uVar4 & su.m_int);
    SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_48);
    local_38.m_int = local_38.m_int & st2.m_int;
    local_38.m_int = BinaryAndHelper<unsigned_long,_char,_1>::And(local_38.m_int,u);
    local_38.m_int = BinaryAndHelper<unsigned_long,_char,_1>::And(local_38.m_int,su.m_int);
    uVar4 = BinaryOrHelper<unsigned_long,_char,_1>::Or(local_38.m_int,u);
    local_48._0_1_ = (SafeInt)((byte)uVar4 | su.m_int);
    SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_48);
    local_38.m_int = local_38.m_int | st2.m_int;
    local_38.m_int = BinaryOrHelper<unsigned_long,_char,_1>::Or(local_38.m_int,u);
    local_38.m_int = BinaryOrHelper<unsigned_long,_char,_1>::Or(local_38.m_int,su.m_int);
    uVar4 = BinaryXorHelper<unsigned_long,_char,_1>::Xor(local_38.m_int,u);
    local_48 = CONCAT31(local_48._1_3_,(byte)uVar4 ^ su.m_int);
    SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_48);
    local_38.m_int = local_38.m_int ^ st2.m_int;
    local_38.m_int = BinaryXorHelper<unsigned_long,_char,_1>::Xor(local_38.m_int,u);
    BinaryXorHelper<unsigned_long,_char,_1>::Xor(local_38.m_int,su.m_int);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}